

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

type * __thiscall
duckdb::Deserializer::Read<duckdb::vector<duckdb::ExportedTableInfo,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  ExportedTableInfo val;
  undefined1 local_d0 [160];
  
  (__return_storage_ptr__->
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>).
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>).
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>).
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      ExportedTableInfo::Deserialize((ExportedTableInfo *)local_d0,this);
      (*this->_vptr_Deserializer[7])(this);
      ::std::vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>::
      emplace_back<duckdb::ExportedTableInfo>
                (&__return_storage_ptr__->
                  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                 ,(ExportedTableInfo *)local_d0);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_d0 + 0x88));
      if ((undefined1 *)local_d0._104_8_ != local_d0 + 0x78) {
        operator_delete((void *)local_d0._104_8_);
      }
      if ((undefined1 *)local_d0._72_8_ != local_d0 + 0x58) {
        operator_delete((void *)local_d0._72_8_);
      }
      if ((undefined1 *)local_d0._40_8_ != local_d0 + 0x38) {
        operator_delete((void *)local_d0._40_8_);
      }
      if ((undefined1 *)local_d0._8_8_ != local_d0 + 0x18) {
        operator_delete((void *)local_d0._8_8_);
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}